

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  uint uVar1;
  ImVec2 IVar2;
  ImDrawVert *pIVar3;
  long lVar4;
  ImDrawIdx *pIVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ImDrawIdx IVar9;
  ulong uVar10;
  ImDrawIdx IVar11;
  int iVar12;
  undefined1 *puVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  ulong local_78;
  ImVec2 local_70;
  uint *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined1 *local_48;
  float local_40;
  ImU32 local_3c;
  uint local_38;
  ImU32 local_34;
  
  if (2 < points_count) {
    IVar2 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 2) == 0) {
      uStack_90 = 0x12acdb;
      PrimReserve(this,points_count * 3 + -6,points_count);
      uVar7 = 0;
      do {
        this->_VtxWritePtr->pos = points[uVar7];
        this->_VtxWritePtr->uv = IVar2;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = col;
        this->_VtxWritePtr = pIVar3 + 1;
        uVar7 = uVar7 + 1;
      } while ((uint)points_count != uVar7);
      uVar1 = this->_VtxCurrentIdx;
      iVar6 = 3;
      if (3 < points_count) {
        iVar6 = points_count;
      }
      pIVar5 = this->_IdxWritePtr;
      iVar6 = iVar6 + -2;
      iVar12 = uVar1 + 2;
      do {
        *pIVar5 = (ImDrawIdx)uVar1;
        pIVar5[1] = (ImDrawIdx)iVar12 - 1;
        pIVar5[2] = (ImDrawIdx)iVar12;
        pIVar5 = pIVar5 + 3;
        iVar12 = iVar12 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      this->_IdxWritePtr = pIVar5;
      local_38 = points_count & 0xffff;
      local_68 = &this->_VtxCurrentIdx;
    }
    else {
      local_34 = col & 0xffffff;
      local_38 = points_count * 2;
      uStack_90 = 0x12ad7b;
      local_70 = IVar2;
      local_3c = col;
      PrimReserve(this,points_count * 9 + -6,local_38);
      local_68 = &this->_VtxCurrentIdx;
      uVar1 = this->_VtxCurrentIdx;
      local_50 = (ulong)(uVar1 + 1);
      pIVar5 = this->_IdxWritePtr;
      iVar6 = points_count + -2;
      iVar12 = uVar1 + 2;
      do {
        *pIVar5 = (ImDrawIdx)uVar1;
        pIVar5[1] = (ImDrawIdx)iVar12;
        iVar12 = iVar12 + 2;
        pIVar5[2] = (ImDrawIdx)iVar12;
        pIVar5 = pIVar5 + 3;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      local_58 = (ulong)uVar1;
      this->_IdxWritePtr = pIVar5;
      lVar4 = -((ulong)(uint)points_count * 8 + 0xf & 0xfffffffffffffff0);
      puVar13 = local_88 + lVar4;
      iVar6 = points_count + -1;
      local_60 = (ulong)(uint)points_count;
      uVar7 = 1;
      if (1 < points_count) {
        uVar7 = (ulong)(uint)points_count;
      }
      uVar8 = 0;
      local_48 = puVar13;
      local_78 = uVar7;
      iVar12 = iVar6;
      do {
        lVar14 = (long)iVar12;
        local_88._0_4_ = points[uVar8].x - points[lVar14].x;
        local_40 = points[uVar8].y - points[lVar14].y;
        fVar15 = (float)local_88._0_4_ * (float)local_88._0_4_ + local_40 * local_40;
        if (0.0 < fVar15) {
          if (fVar15 < 0.0) {
            local_88 = ZEXT416((uint)local_88._0_4_);
            *(undefined8 *)(local_88 + lVar4 + -8) = 0x12ae4d;
            fVar15 = sqrtf(fVar15);
            uVar7 = local_78;
            puVar13 = local_48;
          }
          else {
            fVar15 = SQRT(fVar15);
          }
          local_88._0_4_ = (float)local_88._0_4_ * (1.0 / fVar15);
          local_40 = local_40 * (1.0 / fVar15);
        }
        *(float *)(puVar13 + lVar14 * 8) = local_40;
        *(float *)(puVar13 + lVar14 * 8 + 4) = -(float)local_88._0_4_;
        iVar12 = (int)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
      uVar7 = 1;
      if (1 < (int)local_60) {
        uVar7 = local_60 & 0xffffffff;
      }
      uVar8 = 0;
      uVar10 = local_58 & 0xffffffff;
      do {
        fVar16 = (*(float *)(puVar13 + (long)iVar6 * 8) + *(float *)(puVar13 + uVar8 * 8)) * 0.5;
        fVar17 = (*(float *)(puVar13 + (long)iVar6 * 8 + 4) + *(float *)(puVar13 + uVar8 * 8 + 4)) *
                 0.5;
        fVar18 = fVar16 * fVar16 + fVar17 * fVar17;
        fVar15 = 0.5;
        if (0.5 <= fVar18) {
          fVar15 = fVar18;
        }
        fVar16 = fVar16 * (1.0 / fVar15) * 0.5;
        fVar15 = (1.0 / fVar15) * fVar17 * 0.5;
        pIVar3 = this->_VtxWritePtr;
        (pIVar3->pos).x = points[uVar8].x - fVar16;
        (pIVar3->pos).y = points[uVar8].y - fVar15;
        pIVar3->uv = local_70;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = local_3c;
        pIVar3[1].pos.x = fVar16 + points[uVar8].x;
        pIVar3[1].pos.y = fVar15 + points[uVar8].y;
        pIVar3[1].uv = local_70;
        pIVar3 = this->_VtxWritePtr;
        pIVar3[1].col = local_34;
        this->_VtxWritePtr = pIVar3 + 2;
        pIVar5 = this->_IdxWritePtr;
        IVar9 = (ImDrawIdx)uVar10;
        *pIVar5 = IVar9;
        pIVar5[1] = (short)local_58 + (short)iVar6 * 2;
        IVar11 = (short)local_50 + (short)iVar6 * 2;
        pIVar5[2] = IVar11;
        pIVar5[3] = IVar11;
        pIVar5[4] = IVar9 + 1;
        pIVar5[5] = IVar9;
        this->_IdxWritePtr = pIVar5 + 6;
        iVar6 = (int)uVar8;
        uVar8 = uVar8 + 1;
        uVar10 = (ulong)((int)uVar10 + 2);
        puVar13 = local_48;
      } while (uVar7 != uVar8);
      local_38 = local_38 & 0xfffe;
    }
    *local_68 = *local_68 + local_38;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}